

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_image * nifti_make_new_nim(int *dims,int datatype,int data_fill)

{
  int iVar1;
  undefined4 uVar2;
  size_t __nmemb;
  nifti_1_header nhdr_00;
  void *pvVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  undefined1 in_stack_fffffffffffffd08 [344];
  undefined8 local_190 [43];
  char local_38 [4];
  nifti_1_header *local_30;
  nifti_1_header *nhdr;
  nifti_image *nim;
  int data_fill_local;
  int datatype_local;
  int *dims_local;
  
  bVar7 = 0;
  nim._0_4_ = data_fill;
  nim._4_4_ = datatype;
  _data_fill_local = dims;
  local_30 = nifti_make_new_header(dims,datatype);
  if (local_30 == (nifti_1_header *)0x0) {
    dims_local = (int *)0x0;
  }
  else {
    memcpy(local_190,local_30,0x15c);
    puVar5 = local_190;
    puVar6 = (undefined8 *)&stack0xfffffffffffffd08;
    for (lVar4 = 0x2b; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    nhdr_00.magic[0] = local_38[0];
    nhdr_00.magic[1] = local_38[1];
    nhdr_00.magic[2] = local_38[2];
    nhdr_00.magic[3] = local_38[3];
    nhdr_00.sizeof_hdr = in_stack_fffffffffffffd08._0_4_;
    nhdr_00.data_type[0] = in_stack_fffffffffffffd08[4];
    nhdr_00.data_type[1] = in_stack_fffffffffffffd08[5];
    nhdr_00.data_type[2] = in_stack_fffffffffffffd08[6];
    nhdr_00.data_type[3] = in_stack_fffffffffffffd08[7];
    nhdr_00.data_type[4] = in_stack_fffffffffffffd08[8];
    nhdr_00.data_type[5] = in_stack_fffffffffffffd08[9];
    nhdr_00.data_type[6] = in_stack_fffffffffffffd08[10];
    nhdr_00.data_type[7] = in_stack_fffffffffffffd08[0xb];
    nhdr_00.data_type[8] = in_stack_fffffffffffffd08[0xc];
    nhdr_00.data_type[9] = in_stack_fffffffffffffd08[0xd];
    nhdr_00.db_name[0] = in_stack_fffffffffffffd08[0xe];
    nhdr_00.db_name[1] = in_stack_fffffffffffffd08[0xf];
    nhdr_00.db_name[2] = in_stack_fffffffffffffd08[0x10];
    nhdr_00.db_name[3] = in_stack_fffffffffffffd08[0x11];
    nhdr_00.db_name[4] = in_stack_fffffffffffffd08[0x12];
    nhdr_00.db_name[5] = in_stack_fffffffffffffd08[0x13];
    nhdr_00.db_name[6] = in_stack_fffffffffffffd08[0x14];
    nhdr_00.db_name[7] = in_stack_fffffffffffffd08[0x15];
    nhdr_00.db_name[8] = in_stack_fffffffffffffd08[0x16];
    nhdr_00.db_name[9] = in_stack_fffffffffffffd08[0x17];
    nhdr_00.db_name[10] = in_stack_fffffffffffffd08[0x18];
    nhdr_00.db_name[0xb] = in_stack_fffffffffffffd08[0x19];
    nhdr_00.db_name[0xc] = in_stack_fffffffffffffd08[0x1a];
    nhdr_00.db_name[0xd] = in_stack_fffffffffffffd08[0x1b];
    nhdr_00.db_name[0xe] = in_stack_fffffffffffffd08[0x1c];
    nhdr_00.db_name[0xf] = in_stack_fffffffffffffd08[0x1d];
    nhdr_00.db_name[0x10] = in_stack_fffffffffffffd08[0x1e];
    nhdr_00.db_name[0x11] = in_stack_fffffffffffffd08[0x1f];
    nhdr_00.extents = in_stack_fffffffffffffd08._32_4_;
    nhdr_00.session_error = in_stack_fffffffffffffd08._36_2_;
    nhdr_00.regular = in_stack_fffffffffffffd08[0x26];
    nhdr_00.dim_info = in_stack_fffffffffffffd08[0x27];
    nhdr_00.dim[0] = in_stack_fffffffffffffd08._40_2_;
    nhdr_00.dim[1] = in_stack_fffffffffffffd08._42_2_;
    nhdr_00.dim[2] = in_stack_fffffffffffffd08._44_2_;
    nhdr_00.dim[3] = in_stack_fffffffffffffd08._46_2_;
    nhdr_00.dim[4] = in_stack_fffffffffffffd08._48_2_;
    nhdr_00.dim[5] = in_stack_fffffffffffffd08._50_2_;
    nhdr_00.dim[6] = in_stack_fffffffffffffd08._52_2_;
    nhdr_00.dim[7] = in_stack_fffffffffffffd08._54_2_;
    nhdr_00.intent_p1 = (float)in_stack_fffffffffffffd08._56_4_;
    nhdr_00.intent_p2 = (float)in_stack_fffffffffffffd08._60_4_;
    nhdr_00.intent_p3 = (float)in_stack_fffffffffffffd08._64_4_;
    nhdr_00.intent_code = in_stack_fffffffffffffd08._68_2_;
    nhdr_00.datatype = in_stack_fffffffffffffd08._70_2_;
    nhdr_00.bitpix = in_stack_fffffffffffffd08._72_2_;
    nhdr_00.slice_start = in_stack_fffffffffffffd08._74_2_;
    nhdr_00.pixdim[0] = (float)in_stack_fffffffffffffd08._76_4_;
    nhdr_00.pixdim[1] = (float)in_stack_fffffffffffffd08._80_4_;
    nhdr_00.pixdim[2] = (float)in_stack_fffffffffffffd08._84_4_;
    nhdr_00.pixdim[3] = (float)in_stack_fffffffffffffd08._88_4_;
    nhdr_00.pixdim[4] = (float)in_stack_fffffffffffffd08._92_4_;
    nhdr_00.pixdim[5] = (float)in_stack_fffffffffffffd08._96_4_;
    nhdr_00.pixdim[6] = (float)in_stack_fffffffffffffd08._100_4_;
    nhdr_00.pixdim[7] = (float)in_stack_fffffffffffffd08._104_4_;
    nhdr_00.vox_offset = (float)in_stack_fffffffffffffd08._108_4_;
    nhdr_00.scl_slope = (float)in_stack_fffffffffffffd08._112_4_;
    nhdr_00.scl_inter = (float)in_stack_fffffffffffffd08._116_4_;
    nhdr_00.slice_end = in_stack_fffffffffffffd08._120_2_;
    nhdr_00.slice_code = in_stack_fffffffffffffd08[0x7a];
    nhdr_00.xyzt_units = in_stack_fffffffffffffd08[0x7b];
    nhdr_00.cal_max = (float)in_stack_fffffffffffffd08._124_4_;
    nhdr_00.cal_min = (float)in_stack_fffffffffffffd08._128_4_;
    nhdr_00.slice_duration = (float)in_stack_fffffffffffffd08._132_4_;
    nhdr_00.toffset = (float)in_stack_fffffffffffffd08._136_4_;
    nhdr_00.glmax = in_stack_fffffffffffffd08._140_4_;
    nhdr_00.glmin = in_stack_fffffffffffffd08._144_4_;
    nhdr_00.descrip[0] = in_stack_fffffffffffffd08[0x94];
    nhdr_00.descrip[1] = in_stack_fffffffffffffd08[0x95];
    nhdr_00.descrip[2] = in_stack_fffffffffffffd08[0x96];
    nhdr_00.descrip[3] = in_stack_fffffffffffffd08[0x97];
    nhdr_00.descrip[4] = in_stack_fffffffffffffd08[0x98];
    nhdr_00.descrip[5] = in_stack_fffffffffffffd08[0x99];
    nhdr_00.descrip[6] = in_stack_fffffffffffffd08[0x9a];
    nhdr_00.descrip[7] = in_stack_fffffffffffffd08[0x9b];
    nhdr_00.descrip[8] = in_stack_fffffffffffffd08[0x9c];
    nhdr_00.descrip[9] = in_stack_fffffffffffffd08[0x9d];
    nhdr_00.descrip[10] = in_stack_fffffffffffffd08[0x9e];
    nhdr_00.descrip[0xb] = in_stack_fffffffffffffd08[0x9f];
    nhdr_00.descrip[0xc] = in_stack_fffffffffffffd08[0xa0];
    nhdr_00.descrip[0xd] = in_stack_fffffffffffffd08[0xa1];
    nhdr_00.descrip[0xe] = in_stack_fffffffffffffd08[0xa2];
    nhdr_00.descrip[0xf] = in_stack_fffffffffffffd08[0xa3];
    nhdr_00.descrip[0x10] = in_stack_fffffffffffffd08[0xa4];
    nhdr_00.descrip[0x11] = in_stack_fffffffffffffd08[0xa5];
    nhdr_00.descrip[0x12] = in_stack_fffffffffffffd08[0xa6];
    nhdr_00.descrip[0x13] = in_stack_fffffffffffffd08[0xa7];
    nhdr_00.descrip[0x14] = in_stack_fffffffffffffd08[0xa8];
    nhdr_00.descrip[0x15] = in_stack_fffffffffffffd08[0xa9];
    nhdr_00.descrip[0x16] = in_stack_fffffffffffffd08[0xaa];
    nhdr_00.descrip[0x17] = in_stack_fffffffffffffd08[0xab];
    nhdr_00.descrip[0x18] = in_stack_fffffffffffffd08[0xac];
    nhdr_00.descrip[0x19] = in_stack_fffffffffffffd08[0xad];
    nhdr_00.descrip[0x1a] = in_stack_fffffffffffffd08[0xae];
    nhdr_00.descrip[0x1b] = in_stack_fffffffffffffd08[0xaf];
    nhdr_00.descrip[0x1c] = in_stack_fffffffffffffd08[0xb0];
    nhdr_00.descrip[0x1d] = in_stack_fffffffffffffd08[0xb1];
    nhdr_00.descrip[0x1e] = in_stack_fffffffffffffd08[0xb2];
    nhdr_00.descrip[0x1f] = in_stack_fffffffffffffd08[0xb3];
    nhdr_00.descrip[0x20] = in_stack_fffffffffffffd08[0xb4];
    nhdr_00.descrip[0x21] = in_stack_fffffffffffffd08[0xb5];
    nhdr_00.descrip[0x22] = in_stack_fffffffffffffd08[0xb6];
    nhdr_00.descrip[0x23] = in_stack_fffffffffffffd08[0xb7];
    nhdr_00.descrip[0x24] = in_stack_fffffffffffffd08[0xb8];
    nhdr_00.descrip[0x25] = in_stack_fffffffffffffd08[0xb9];
    nhdr_00.descrip[0x26] = in_stack_fffffffffffffd08[0xba];
    nhdr_00.descrip[0x27] = in_stack_fffffffffffffd08[0xbb];
    nhdr_00.descrip[0x28] = in_stack_fffffffffffffd08[0xbc];
    nhdr_00.descrip[0x29] = in_stack_fffffffffffffd08[0xbd];
    nhdr_00.descrip[0x2a] = in_stack_fffffffffffffd08[0xbe];
    nhdr_00.descrip[0x2b] = in_stack_fffffffffffffd08[0xbf];
    nhdr_00.descrip[0x2c] = in_stack_fffffffffffffd08[0xc0];
    nhdr_00.descrip[0x2d] = in_stack_fffffffffffffd08[0xc1];
    nhdr_00.descrip[0x2e] = in_stack_fffffffffffffd08[0xc2];
    nhdr_00.descrip[0x2f] = in_stack_fffffffffffffd08[0xc3];
    nhdr_00.descrip[0x30] = in_stack_fffffffffffffd08[0xc4];
    nhdr_00.descrip[0x31] = in_stack_fffffffffffffd08[0xc5];
    nhdr_00.descrip[0x32] = in_stack_fffffffffffffd08[0xc6];
    nhdr_00.descrip[0x33] = in_stack_fffffffffffffd08[199];
    nhdr_00.descrip[0x34] = in_stack_fffffffffffffd08[200];
    nhdr_00.descrip[0x35] = in_stack_fffffffffffffd08[0xc9];
    nhdr_00.descrip[0x36] = in_stack_fffffffffffffd08[0xca];
    nhdr_00.descrip[0x37] = in_stack_fffffffffffffd08[0xcb];
    nhdr_00.descrip[0x38] = in_stack_fffffffffffffd08[0xcc];
    nhdr_00.descrip[0x39] = in_stack_fffffffffffffd08[0xcd];
    nhdr_00.descrip[0x3a] = in_stack_fffffffffffffd08[0xce];
    nhdr_00.descrip[0x3b] = in_stack_fffffffffffffd08[0xcf];
    nhdr_00.descrip[0x3c] = in_stack_fffffffffffffd08[0xd0];
    nhdr_00.descrip[0x3d] = in_stack_fffffffffffffd08[0xd1];
    nhdr_00.descrip[0x3e] = in_stack_fffffffffffffd08[0xd2];
    nhdr_00.descrip[0x3f] = in_stack_fffffffffffffd08[0xd3];
    nhdr_00.descrip[0x40] = in_stack_fffffffffffffd08[0xd4];
    nhdr_00.descrip[0x41] = in_stack_fffffffffffffd08[0xd5];
    nhdr_00.descrip[0x42] = in_stack_fffffffffffffd08[0xd6];
    nhdr_00.descrip[0x43] = in_stack_fffffffffffffd08[0xd7];
    nhdr_00.descrip[0x44] = in_stack_fffffffffffffd08[0xd8];
    nhdr_00.descrip[0x45] = in_stack_fffffffffffffd08[0xd9];
    nhdr_00.descrip[0x46] = in_stack_fffffffffffffd08[0xda];
    nhdr_00.descrip[0x47] = in_stack_fffffffffffffd08[0xdb];
    nhdr_00.descrip[0x48] = in_stack_fffffffffffffd08[0xdc];
    nhdr_00.descrip[0x49] = in_stack_fffffffffffffd08[0xdd];
    nhdr_00.descrip[0x4a] = in_stack_fffffffffffffd08[0xde];
    nhdr_00.descrip[0x4b] = in_stack_fffffffffffffd08[0xdf];
    nhdr_00.descrip[0x4c] = in_stack_fffffffffffffd08[0xe0];
    nhdr_00.descrip[0x4d] = in_stack_fffffffffffffd08[0xe1];
    nhdr_00.descrip[0x4e] = in_stack_fffffffffffffd08[0xe2];
    nhdr_00.descrip[0x4f] = in_stack_fffffffffffffd08[0xe3];
    nhdr_00.aux_file[0] = in_stack_fffffffffffffd08[0xe4];
    nhdr_00.aux_file[1] = in_stack_fffffffffffffd08[0xe5];
    nhdr_00.aux_file[2] = in_stack_fffffffffffffd08[0xe6];
    nhdr_00.aux_file[3] = in_stack_fffffffffffffd08[0xe7];
    nhdr_00.aux_file[4] = in_stack_fffffffffffffd08[0xe8];
    nhdr_00.aux_file[5] = in_stack_fffffffffffffd08[0xe9];
    nhdr_00.aux_file[6] = in_stack_fffffffffffffd08[0xea];
    nhdr_00.aux_file[7] = in_stack_fffffffffffffd08[0xeb];
    nhdr_00.aux_file[8] = in_stack_fffffffffffffd08[0xec];
    nhdr_00.aux_file[9] = in_stack_fffffffffffffd08[0xed];
    nhdr_00.aux_file[10] = in_stack_fffffffffffffd08[0xee];
    nhdr_00.aux_file[0xb] = in_stack_fffffffffffffd08[0xef];
    nhdr_00.aux_file[0xc] = in_stack_fffffffffffffd08[0xf0];
    nhdr_00.aux_file[0xd] = in_stack_fffffffffffffd08[0xf1];
    nhdr_00.aux_file[0xe] = in_stack_fffffffffffffd08[0xf2];
    nhdr_00.aux_file[0xf] = in_stack_fffffffffffffd08[0xf3];
    nhdr_00.aux_file[0x10] = in_stack_fffffffffffffd08[0xf4];
    nhdr_00.aux_file[0x11] = in_stack_fffffffffffffd08[0xf5];
    nhdr_00.aux_file[0x12] = in_stack_fffffffffffffd08[0xf6];
    nhdr_00.aux_file[0x13] = in_stack_fffffffffffffd08[0xf7];
    nhdr_00.aux_file[0x14] = in_stack_fffffffffffffd08[0xf8];
    nhdr_00.aux_file[0x15] = in_stack_fffffffffffffd08[0xf9];
    nhdr_00.aux_file[0x16] = in_stack_fffffffffffffd08[0xfa];
    nhdr_00.aux_file[0x17] = in_stack_fffffffffffffd08[0xfb];
    nhdr_00.qform_code = in_stack_fffffffffffffd08._252_2_;
    nhdr_00.sform_code = in_stack_fffffffffffffd08._254_2_;
    nhdr_00.quatern_b = (float)in_stack_fffffffffffffd08._256_4_;
    nhdr_00.quatern_c = (float)in_stack_fffffffffffffd08._260_4_;
    nhdr_00.quatern_d = (float)in_stack_fffffffffffffd08._264_4_;
    nhdr_00.qoffset_x = (float)in_stack_fffffffffffffd08._268_4_;
    nhdr_00.qoffset_y = (float)in_stack_fffffffffffffd08._272_4_;
    nhdr_00.qoffset_z = (float)in_stack_fffffffffffffd08._276_4_;
    nhdr_00.srow_x[0] = (float)in_stack_fffffffffffffd08._280_4_;
    nhdr_00.srow_x[1] = (float)in_stack_fffffffffffffd08._284_4_;
    nhdr_00.srow_x[2] = (float)in_stack_fffffffffffffd08._288_4_;
    nhdr_00.srow_x[3] = (float)in_stack_fffffffffffffd08._292_4_;
    nhdr_00.srow_y[0] = (float)in_stack_fffffffffffffd08._296_4_;
    nhdr_00.srow_y[1] = (float)in_stack_fffffffffffffd08._300_4_;
    nhdr_00.srow_y[2] = (float)in_stack_fffffffffffffd08._304_4_;
    nhdr_00.srow_y[3] = (float)in_stack_fffffffffffffd08._308_4_;
    nhdr_00.srow_z[0] = (float)in_stack_fffffffffffffd08._312_4_;
    nhdr_00.srow_z[1] = (float)in_stack_fffffffffffffd08._316_4_;
    nhdr_00.srow_z[2] = (float)in_stack_fffffffffffffd08._320_4_;
    nhdr_00.srow_z[3] = (float)in_stack_fffffffffffffd08._324_4_;
    nhdr_00.intent_name[0] = in_stack_fffffffffffffd08[0x148];
    nhdr_00.intent_name[1] = in_stack_fffffffffffffd08[0x149];
    nhdr_00.intent_name[2] = in_stack_fffffffffffffd08[0x14a];
    nhdr_00.intent_name[3] = in_stack_fffffffffffffd08[0x14b];
    nhdr_00.intent_name[4] = in_stack_fffffffffffffd08[0x14c];
    nhdr_00.intent_name[5] = in_stack_fffffffffffffd08[0x14d];
    nhdr_00.intent_name[6] = in_stack_fffffffffffffd08[0x14e];
    nhdr_00.intent_name[7] = in_stack_fffffffffffffd08[0x14f];
    nhdr_00.intent_name[8] = in_stack_fffffffffffffd08[0x150];
    nhdr_00.intent_name[9] = in_stack_fffffffffffffd08[0x151];
    nhdr_00.intent_name[10] = in_stack_fffffffffffffd08[0x152];
    nhdr_00.intent_name[0xb] = in_stack_fffffffffffffd08[0x153];
    nhdr_00.intent_name[0xc] = in_stack_fffffffffffffd08[0x154];
    nhdr_00.intent_name[0xd] = in_stack_fffffffffffffd08[0x155];
    nhdr_00.intent_name[0xe] = in_stack_fffffffffffffd08[0x156];
    nhdr_00.intent_name[0xf] = in_stack_fffffffffffffd08[0x157];
    nhdr = (nifti_1_header *)nifti_convert_nhdr2nim(nhdr_00,(char *)0x0);
    free(local_30);
    if (nhdr == (nifti_1_header *)0x0) {
      fprintf(_stderr,"** NMNN: nifti_convert_nhdr2nim failure\n");
      dims_local = (int *)0x0;
    }
    else {
      if (1 < g_opts.debug) {
        fprintf(_stderr,"+d nifti_make_new_nim, data_fill = %d\n",(ulong)(uint)nim);
      }
      if ((uint)nim != 0) {
        __nmemb._0_4_ = nhdr->intent_p3;
        __nmemb._4_2_ = nhdr->intent_code;
        __nmemb._6_2_ = nhdr->datatype;
        iVar1._0_2_ = nhdr->bitpix;
        iVar1._2_2_ = nhdr->slice_start;
        pvVar3 = calloc(__nmemb,(long)iVar1);
        *(void **)(nhdr[1].srow_z + 1) = pvVar3;
        if (*(long *)(nhdr[1].srow_z + 1) == 0) {
          uVar2 = nhdr->intent_p3;
          fprintf(_stderr,"** NMNN: failed to alloc %u bytes for data\n",
                  (ulong)(uint)(uVar2 * *(int *)&nhdr->bitpix));
          nifti_image_free((nifti_image *)nhdr);
          nhdr = (nifti_1_header *)0x0;
        }
      }
      dims_local = &nhdr->sizeof_hdr;
    }
  }
  return (nifti_image *)dims_local;
}

Assistant:

nifti_image * nifti_make_new_nim(const int dims[], int datatype, int data_fill)
{
   nifti_image    * nim;
   nifti_1_header * nhdr;

   nhdr = nifti_make_new_header(dims, datatype);
   if( !nhdr ) return NULL;  /* error already printed */

   nim = nifti_convert_nhdr2nim(*nhdr,NULL);
   free(nhdr);               /* in any case, we are done with this */
   if( !nim ){
      fprintf(stderr,"** NMNN: nifti_convert_nhdr2nim failure\n");
      return NULL;
   }

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d nifti_make_new_nim, data_fill = %d\n",data_fill);

   if( data_fill ) {
      nim->data = calloc(nim->nvox, nim->nbyper);

      /* if we cannot allocate data, take ball and go home */
      if( !nim->data ) {
         fprintf(stderr,"** NMNN: failed to alloc %u bytes for data\n",
                 (unsigned)(nim->nvox*nim->nbyper));
         nifti_image_free(nim);
         nim = NULL;
      }
   }

   return nim;
}